

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O1

void apx_attributeParser_reset(apx_attributeParser_t *self)

{
  apx_attributeParseState_t *self_00;
  
  self->last_error = 0;
  self->error_next = (uint8_t *)0x0;
  adt_stack_clear(&self->stack);
  self_00 = self->state;
  if (self_00 != (apx_attributeParseState_t *)0x0) {
    apx_attributeParseState_destroy(self_00);
    free(self_00);
    self->state = (apx_attributeParseState_t *)0x0;
  }
  return;
}

Assistant:

static void apx_attributeParser_reset(apx_attributeParser_t* self)
{
   assert(self != NULL);
   self->last_error = APX_NO_ERROR;
   self->error_next = NULL;
   adt_stack_clear(&self->stack);
   if (self->state != NULL)
   {
      apx_attributeParseState_delete(self->state);
      self->state = NULL;
   }
}